

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O0

bool __thiscall jbcoin::STArray::isEquivalent(STArray *this,STBase *t)

{
  bool local_39;
  long local_38;
  STArray *v;
  STBase *t_local;
  STArray *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if (local_38 != 0) {
    local_39 = std::operator==(&this->v_,
                               (vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)
                               (local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool STArray::isEquivalent (const STBase& t) const
{
    auto v = dynamic_cast<const STArray*> (&t);
    return v != nullptr && v_ == v->v_;
}